

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectMultipleCallsWithParameters_Test::testBody
          (TEST_MockParameterTest_expectMultipleCallsWithParameters_Test *this)

{
  int iVar1;
  MockSupport *pMVar2;
  undefined4 extraout_var;
  MockExpectedCall *pMVar3;
  undefined4 extraout_var_00;
  MockActualCall *pMVar4;
  undefined4 extraout_var_01;
  SimpleString local_158;
  SimpleString local_148;
  SimpleString local_138;
  SimpleString local_128;
  SimpleString local_118;
  SimpleString local_108;
  SimpleString local_f8;
  SimpleString local_e8;
  SimpleString local_d8;
  SimpleString local_c8;
  SimpleString local_b8;
  SimpleString local_a8;
  SimpleString local_98;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  SimpleString local_48 [2];
  SimpleString local_28;
  uint local_18;
  int local_14;
  uint expected_uint;
  int expected_int;
  TEST_MockParameterTest_expectMultipleCallsWithParameters_Test *this_local;
  
  local_14 = -7;
  local_18 = 7;
  _expected_uint = this;
  SimpleString::SimpleString(&local_28,"");
  pMVar2 = mock(&local_28,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(local_48,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[5])(pMVar2,2,local_48);
  SimpleString::SimpleString(&local_58,"double");
  pMVar3 = MockExpectedCall::withParameter
                     ((MockExpectedCall *)CONCAT44(extraout_var,iVar1),&local_58,1.0);
  SimpleString::SimpleString(&local_68,"int");
  pMVar3 = MockExpectedCall::withParameter(pMVar3,&local_68,local_14);
  SimpleString::SimpleString(&local_78,"string");
  pMVar3 = MockExpectedCall::withParameter(pMVar3,&local_78,"string");
  SimpleString::SimpleString(&local_88,"uint");
  MockExpectedCall::withParameter(pMVar3,&local_88,local_18);
  SimpleString::~SimpleString(&local_88);
  SimpleString::~SimpleString(&local_78);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  SimpleString::~SimpleString(local_48);
  SimpleString::~SimpleString(&local_28);
  SimpleString::SimpleString(&local_98,"");
  pMVar2 = mock(&local_98,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_a8,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_a8);
  SimpleString::SimpleString(&local_b8,"double");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_00,iVar1),&local_b8,1.0);
  SimpleString::SimpleString(&local_c8,"int");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_c8,local_14);
  SimpleString::SimpleString(&local_d8,"string");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_d8,"string");
  SimpleString::SimpleString(&local_e8,"uint");
  MockActualCall::withParameter(pMVar4,&local_e8,local_18);
  SimpleString::~SimpleString(&local_e8);
  SimpleString::~SimpleString(&local_d8);
  SimpleString::~SimpleString(&local_c8);
  SimpleString::~SimpleString(&local_b8);
  SimpleString::~SimpleString(&local_a8);
  SimpleString::~SimpleString(&local_98);
  SimpleString::SimpleString(&local_f8,"");
  pMVar2 = mock(&local_f8,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_108,"boo");
  iVar1 = (*pMVar2->_vptr_MockSupport[6])(pMVar2,&local_108);
  SimpleString::SimpleString(&local_118,"double");
  pMVar4 = MockActualCall::withParameter
                     ((MockActualCall *)CONCAT44(extraout_var_01,iVar1),&local_118,1.0);
  SimpleString::SimpleString(&local_128,"int");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_128,local_14);
  SimpleString::SimpleString(&local_138,"string");
  pMVar4 = MockActualCall::withParameter(pMVar4,&local_138,"string");
  SimpleString::SimpleString(&local_148,"uint");
  MockActualCall::withParameter(pMVar4,&local_148,local_18);
  SimpleString::~SimpleString(&local_148);
  SimpleString::~SimpleString(&local_138);
  SimpleString::~SimpleString(&local_128);
  SimpleString::~SimpleString(&local_118);
  SimpleString::~SimpleString(&local_108);
  SimpleString::~SimpleString(&local_f8);
  SimpleString::SimpleString(&local_158,"");
  pMVar2 = mock(&local_158,(MockFailureReporter *)0x0);
  (*pMVar2->_vptr_MockSupport[0x25])();
  SimpleString::~SimpleString(&local_158);
  return;
}

Assistant:

TEST(MockParameterTest, expectMultipleCallsWithParameters)
{
    int expected_int = -7;
    unsigned int expected_uint = 7;

    mock().expectNCalls(2, "boo").withParameter("double", 1.0).withParameter("int", expected_int).
        withParameter("string", "string").withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);
    mock().actualCall("boo").withParameter("double", 1.0).withParameter("int", expected_int).withParameter("string", "string").
        withParameter("uint", expected_uint);

    mock().checkExpectations();
}